

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaOutputFile::ToYca::writePixels(ToYca *this,int numScanLines)

{
  Rgba *pRVar1;
  int j_3;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int j;
  long lVar4;
  int iVar5;
  int j_1;
  int iVar6;
  int iVar7;
  bool bVar8;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  pRVar1 = this->_fbBase;
  if (pRVar1 != (Rgba *)0x0) {
    if ((this->_writeY == true) && (this->_writeC == false)) {
      if (numScanLines < 1) {
        numScanLines = 0;
      }
      for (iVar5 = 0; iVar5 != numScanLines; iVar5 = iVar5 + 1) {
        for (lVar4 = 0; lVar4 < this->_width; lVar4 = lVar4 + 1) {
          this->_tmpBuf[lVar4] =
               pRVar1[(this->_xMin + lVar4) * this->_fbXStride +
                      (long)this->_currentScanLine * this->_fbYStride];
        }
        RgbaYca::RGBAtoYCA(&this->_yw,this->_width,this->_writeA,this->_tmpBuf,this->_tmpBuf);
        OutputFile::writePixels(this->_outputFile,1);
        this->_linesConverted = this->_linesConverted + 1;
        this->_currentScanLine =
             this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
      }
    }
    else {
      if (numScanLines < 1) {
        numScanLines = 0;
      }
      for (iVar5 = 0; iVar5 != numScanLines; iVar5 = iVar5 + 1) {
        pRVar1 = this->_fbBase;
        for (lVar4 = 0; lVar4 < this->_width; lVar4 = lVar4 + 1) {
          this->_tmpBuf[lVar4 + 0xd] =
               pRVar1[(this->_xMin + lVar4) * this->_fbXStride +
                      (long)this->_currentScanLine * this->_fbYStride];
        }
        RgbaYca::RGBAtoYCA(&this->_yw,this->_width,this->_writeA,this->_tmpBuf + 0xd,
                           this->_tmpBuf + 0xd);
        padTmpBuf(this);
        rotateBuffers(this);
        RgbaYca::decimateChromaHoriz(this->_width,this->_tmpBuf,this->_buf[0x1a]);
        iVar6 = this->_linesConverted;
        if (iVar6 == 0) {
          iVar6 = 0xd;
          while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
            duplicateLastBuffer(this);
          }
          iVar6 = this->_linesConverted;
        }
        iVar7 = iVar6 + 1;
        this->_linesConverted = iVar7;
        if (0xc < iVar6) {
          decimateChromaVertAndWriteScanLine(this);
          iVar7 = this->_linesConverted;
        }
        iVar6 = this->_height;
        if (iVar6 <= iVar7) {
          for (iVar7 = 0; iVar7 < 0xd - iVar6; iVar7 = iVar7 + 1) {
            duplicateLastBuffer(this);
            iVar6 = this->_height;
          }
          duplicateSecondToLastBuffer(this);
          this->_linesConverted = this->_linesConverted + 1;
          decimateChromaVertAndWriteScanLine(this);
          iVar6 = 1;
          while( true ) {
            iVar7 = this->_height;
            if (0xc < this->_height) {
              iVar7 = 0xd;
            }
            if (iVar7 <= iVar6) break;
            duplicateLastBuffer(this);
            this->_linesConverted = this->_linesConverted + 1;
            decimateChromaVertAndWriteScanLine(this);
            iVar6 = iVar6 + 1;
          }
        }
        this->_currentScanLine =
             this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
      }
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_1a8,
                           "No frame buffer was specified as the pixel data source for image file \""
                          );
  pcVar3 = OutputFile::fileName(this->_outputFile);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
RgbaOutputFile::ToYca::writePixels (int numScanLines)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data source for image file "
            "\"" << _outputFile.fileName ()
                 << "\".");
    }

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    if (_writeY && !_writeC)
    {
        //
        // We are writing only luminance; filtering
        // and subsampling are not necessary.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            for (int j = 0; j < _width; ++j)
            {
                _tmpBuf[j] = *reinterpret_cast<Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
            }

            //
            // Convert the scan line from RGB to luminance/chroma,
            // and store the result in the output file.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf, _tmpBuf);
            _outputFile.writePixels (1);

            ++_linesConverted;

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
    else
    {
        //
        // We are writing chroma; the pixels must be filtered and subsampled.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            intptr_t base = reinterpret_cast<intptr_t> (_fbBase);

            for (int j = 0; j < _width; ++j)
            {
                const Rgba* ptr = reinterpret_cast<const Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
                _tmpBuf[j + N2] = *ptr;
            }

            //
            // Convert the scan line from RGB to luminance/chroma.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf + N2, _tmpBuf + N2);

            //
            // Append N2 copies of the first and last pixel to the
            // beginning and end of the scan line.
            //

            padTmpBuf ();

            //
            // Filter and subsample the scan line's chroma channels
            // horizontally; store the result in _buf.
            //

            rotateBuffers ();
            decimateChromaHoriz (_width, _tmpBuf, _buf[N - 1]);

            //
            // If this is the first scan line in the image,
            // store N2 more copies of the scan line in _buf.
            //

            if (_linesConverted == 0)
            {
                for (int j = 0; j < N2; ++j)
                    duplicateLastBuffer ();
            }

            ++_linesConverted;

            //
            // If we have have converted at least N2 scan lines from
            // RGBA to luminance/chroma, then we can start to filter
            // and subsample vertically, and store pixels in the
            // output file.
            //

            if (_linesConverted > N2) decimateChromaVertAndWriteScanLine ();

            //
            // If we have already converted the last scan line in
            // the image to luminance/chroma, filter, subsample and
            // store the remaining scan lines in _buf.
            //

            if (_linesConverted >= _height)
            {
                for (int j = 0; j < N2 - _height; ++j)
                    duplicateLastBuffer ();

                duplicateSecondToLastBuffer ();
                ++_linesConverted;
                decimateChromaVertAndWriteScanLine ();

                for (int j = 1; j < min (_height, N2); ++j)
                {
                    duplicateLastBuffer ();
                    ++_linesConverted;
                    decimateChromaVertAndWriteScanLine ();
                }
            }

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
}